

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

int ON_DBL::CompareValue(double lhs,double rhs)

{
  double rhs_local;
  double lhs_local;
  
  if (rhs <= lhs) {
    if (lhs <= rhs) {
      if ((lhs != rhs) || (NAN(lhs) || NAN(rhs))) {
        lhs_local._4_4_ = 0;
      }
      else {
        lhs_local._4_4_ = 0;
      }
    }
    else {
      lhs_local._4_4_ = 1;
    }
  }
  else {
    lhs_local._4_4_ = -1;
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_DBL::CompareValue(double lhs, double rhs)
{
  if (lhs < rhs)
    return -1;
  if (lhs > rhs)
    return 1;
  if (lhs == rhs)
    return 0; 

  // At least one of lhs or rhs is a nan. Sort nans to end
  return (ON_IS_NAN(lhs) ? 1 : 0) - (ON_IS_NAN(rhs) ? 1 : 0);
}